

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O2

void anon_unknown.dwarf_187f8::testSetSampleCounts(Box2i *dataWindow)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  double dVar6;
  Box2i *pBVar7;
  ostream *poVar8;
  DeepImageLevel *this;
  TypedDeepImageChannel<float> *pTVar9;
  long lVar10;
  long lVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  uint y;
  ulong uVar17;
  Rand48 random;
  allocator<char> local_101;
  DeepImageLevel *local_100;
  Box2i *local_f8;
  ulong local_f0;
  float oldSamples [20];
  DeepImage img;
  
  poVar8 = std::operator<<((ostream *)&std::cout,"change sample counts, data window = (");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(dataWindow->min).x);
  poVar8 = std::operator<<(poVar8,", ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(dataWindow->min).y);
  poVar8 = std::operator<<(poVar8,") - (");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(dataWindow->max).x);
  poVar8 = std::operator<<(poVar8,", ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(dataWindow->max).y);
  poVar8 = std::operator<<(poVar8,")");
  std::endl<char,std::char_traits<char>>(poVar8);
  Imf_3_4::DeepImage::DeepImage(&img);
  Imf_3_4::Image::resize((Box *)&img,(LevelMode)dataWindow,ROUND_DOWN);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)oldSamples,"F",(allocator<char> *)&random);
  Imf_3_4::Image::insertChannel((string *)&img,(PixelType)oldSamples,2,1,true);
  std::__cxx11::string::~string((string *)oldSamples);
  random._state[0] = 0x5a5a;
  random._state[1] = 0x5a5a;
  random._state[2] = 0x5a5a;
  this = (DeepImageLevel *)Imf_3_4::DeepImage::level((int)&img);
  std::__cxx11::string::string<std::allocator<char>>((string *)oldSamples,"F",&local_101);
  pTVar9 = Imf_3_4::DeepImageLevel::typedChannel<float>(this,(string *)oldSamples);
  std::__cxx11::string::~string((string *)oldSamples);
  local_100 = this + 0x58;
  uVar13 = 0;
  local_f8 = dataWindow;
  do {
    pBVar7 = local_f8;
    if (*(ulong *)(pTVar9 + 0x28) <= uVar13) {
      Imf_3_4::DeepImage::~DeepImage(&img);
      return;
    }
    iVar15 = (local_f8->min).x;
    local_f0 = uVar13;
    lVar10 = Imath_3_2::nrand48(random._state);
    iVar3 = *(int *)(pTVar9 + 0x1c);
    iVar4 = (pBVar7->min).y;
    lVar11 = Imath_3_2::nrand48(random._state);
    iVar15 = iVar15 + (int)(lVar10 % (long)iVar3);
    y = iVar4 + (int)(lVar11 % (long)*(int *)(pTVar9 + 0x20));
    puVar12 = Imf_3_4::SampleCountChannel::at((SampleCountChannel *)local_100,iVar15,y);
    uVar5 = *puVar12;
    uVar17 = (ulong)(int)uVar5;
    lVar10 = Imath_3_2::nrand48(random._state);
    uVar13 = lVar10 % 0x15;
    lVar10 = *(long *)(pTVar9 + 0x38);
    iVar3 = *(int *)(pTVar9 + 0x1c);
    uVar16 = 0;
    if (0 < (int)uVar5) {
      uVar16 = (ulong)uVar5;
    }
    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      oldSamples[uVar14] =
           *(float *)(*(long *)(lVar10 + (long)(int)(iVar3 * y + iVar15) * 8) + uVar14 * 4);
    }
    Imf_3_4::SampleCountChannel::set((int)local_100,iVar15,y);
    lVar10 = (long)(int)(*(int *)(pTVar9 + 0x1c) * y + iVar15);
    if ((int)uVar5 < (int)uVar13) {
      uVar14 = 0;
      while (uVar16 != uVar14) {
        fVar2 = *(float *)(*(long *)(*(long *)(pTVar9 + 0x38) + lVar10 * 8) + uVar14 * 4);
        pfVar1 = oldSamples + uVar14;
        uVar14 = uVar14 + 1;
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("channel (x, y)[j] == oldSamples[j]",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x1ad,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
      }
      for (; uVar13 != uVar17; uVar17 = uVar17 + 1) {
        fVar2 = *(float *)(*(long *)(*(long *)(pTVar9 + 0x38) +
                                    (long)(int)(*(int *)(pTVar9 + 0x1c) * y + iVar15) * 8) +
                          uVar17 * 4);
        if ((fVar2 != 0.0) || (NAN(fVar2))) {
          __assert_fail("channel (x, y)[j] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x1b1,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
        dVar6 = (double)Imath_3_2::erand48(random._state);
        *(float *)(*(long *)(*(long *)(pTVar9 + 0x38) +
                            (long)(int)(*(int *)(pTVar9 + 0x1c) * y + iVar15) * 8) + uVar17 * 4) =
             (float)dVar6;
      }
    }
    else {
      uVar16 = 0;
      if (0 < (int)uVar13) {
        uVar16 = uVar13 & 0xffffffff;
      }
      uVar13 = 0;
      while (uVar16 != uVar13) {
        fVar2 = *(float *)(*(long *)(*(long *)(pTVar9 + 0x38) + lVar10 * 8) + uVar13 * 4);
        pfVar1 = oldSamples + uVar13;
        uVar13 = uVar13 + 1;
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          __assert_fail("channel (x, y)[j] == oldSamples[j]",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRUtilTest/testDeepImage.cpp"
                        ,0x1b8,"void (anonymous namespace)::testSetSampleCounts(const Box2i &)");
        }
      }
    }
    uVar13 = local_f0 + 1;
  } while( true );
}

Assistant:

void
testSetSampleCounts (const Box2i& dataWindow)
{
    cout << "change sample counts, data window = "
            "("
         << dataWindow.min.x << ", " << dataWindow.min.y
         << ") - "
            "("
         << dataWindow.max.x << ", " << dataWindow.max.y << ")" << endl;

    DeepImage img;
    img.resize (dataWindow, ONE_LEVEL, ROUND_DOWN);
    img.insertChannel ("F", FLOAT, 1, 1, false);

    Rand48 random (0);

    DeepImageLevel&     level        = img.level ();
    DeepFloatChannel&   channel      = level.typedChannel<float> ("F");
    SampleCountChannel& sampleCounts = level.sampleCounts ();

    const int MAX_SAMPLES = 20;

    for (size_t i = 0; i < channel.numPixels (); ++i)
    {
        int x = dataWindow.min.x + random.nexti () % channel.pixelsPerRow ();
        int y = dataWindow.min.y + random.nexti () % channel.pixelsPerColumn ();

        int oldN = sampleCounts.at (x, y);
        int newN = random.nexti () % (MAX_SAMPLES + 1);

        float oldSamples[MAX_SAMPLES];

        for (int j = 0; j < oldN; ++j)
            oldSamples[j] = channel (x, y)[j];

        sampleCounts.set (x, y, newN);

        if (newN > oldN)
        {
            for (int j = 0; j < oldN; ++j)
                assert (channel (x, y)[j] == oldSamples[j]);

            for (int j = oldN; j < newN; ++j)
            {
                assert (channel (x, y)[j] == 0);
                channel (x, y)[j] = random.nextf ();
            }
        }
        else
        {
            for (int j = 0; j < newN; ++j)
                assert (channel (x, y)[j] == oldSamples[j]);
        }
    }
}